

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void horn_relax(qnode_ptr_t p,float alpha,int n,char *fn,int prod_err)

{
  qnode_ptr_t q_00;
  disp_field512_t *padVar1;
  void *pvVar2;
  param_t *ppVar3;
  float fVar4;
  undefined4 in_XMM0_Db;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int local_74;
  int local_70;
  int k;
  int j;
  int i;
  float std;
  float avg;
  float v_bar;
  float u_bar;
  param_t f;
  qnode_ptr_t r;
  qnode_ptr_t q;
  int prod_err_local;
  char *fn_local;
  int n_local;
  float alpha_local;
  qnode_ptr_t p_local;
  
  q_00 = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst);
  padVar1 = (disp_field512_t *)malloc(0xc3080);
  q_00->flow_ptr = padVar1;
  if (prod_err != 0) {
    f._24_8_ = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst);
    pvVar2 = malloc(0xc3080);
    *(void **)(f._24_8_ + 0x158) = pvVar2;
    load_velocity((qnode_ptr_t)f._24_8_,fn);
  }
  for (k = p->ofst; k < p->sizy; k = k + 1) {
    for (local_70 = p->ofst; local_70 < p->sizx; local_70 = local_70 + 1) {
      (*p->flow_ptr)[p->res * k + local_70].x = 0.0;
      (*p->flow_ptr)[p->res * k + local_70].y = 0.0;
    }
  }
  for (local_74 = 0; local_74 < n; local_74 = local_74 + 1) {
    for (k = p->ofst; k < p->sizy; k = k + 1) {
      for (local_70 = p->ofst; local_70 < p->sizx; local_70 = local_70 + 1) {
        (*q_00->flow_ptr)[q_00->res * k + local_70] = (*p->flow_ptr)[p->res * k + local_70];
      }
    }
    k = p->ofst;
    while( true ) {
      if (p->sizy - p->ofst <= k) break;
      for (local_70 = p->ofst; local_70 < p->sizx - p->ofst; local_70 = local_70 + 1) {
        if ((*p->param_ptr[p->sizz / 2])[p->res * k + local_70].err == 0) {
          ppVar3 = *p->param_ptr[p->sizz / 2] + (p->res * k + local_70);
          v_bar = ppVar3->fxx;
          unique0x00012004 = ppVar3->fyy;
          f.fxx = ppVar3->fxy;
          f.fyy = ppVar3->ft;
          f.fxy = ppVar3->fx;
          f.ft = ppVar3->fy;
          f.fx = ppVar3->mag;
          f.fy = (float)ppVar3->err;
          avg = lapu(q_00,k,local_70);
          std = lapv(q_00,k,local_70);
          dVar5 = (double)avg;
          fVar4 = f.fxy * (f.fxy * avg + f.ft * std + f.fyy);
          dVar6 = pow((double)f.fxy,2.0);
          dVar7 = pow((double)f.ft,2.0);
          dVar8 = pow((double)(float)(double)CONCAT44(in_XMM0_Db,alpha),2.0);
          (*p->flow_ptr)[p->res * k + local_70].x =
               (float)(dVar5 - (double)fVar4 / (dVar6 + dVar7 + dVar8));
          dVar5 = (double)std;
          fVar4 = f.ft * (f.fxy * avg + f.ft * std + f.fyy);
          dVar6 = pow((double)f.fxy,2.0);
          dVar7 = pow((double)f.ft,2.0);
          dVar8 = pow((double)(float)(double)CONCAT44(in_XMM0_Db,alpha),2.0);
          (*p->flow_ptr)[p->res * k + local_70].y =
               (float)(dVar5 - (double)fVar4 / (dVar6 + dVar7 + dVar8));
        }
      }
      k = k + 1;
    }
    printf(" Iteration %3d :\n",(ulong)(local_74 + 1));
    if (prod_err != 0) {
      flow_error(p,(qnode_ptr_t)f._24_8_,(float *)&i,(float *)&j);
      printf("    Average Angular Error : %10.5f\n",(double)(float)i);
      printf("       Standard Deviation : %10.5f\n",(double)(float)j);
    }
    fVar4 = flow_l2_norm(q_00,p);
    printf("       L2 Norm Difference : %10.5f\n",(double)fVar4);
    fflush(_stdout);
  }
  free(q_00->flow_ptr);
  free(q_00);
  if (prod_err != 0) {
    free(*(void **)(f._24_8_ + 0x158));
    free((void *)f._24_8_);
  }
  return;
}

Assistant:

void horn_relax(p,alpha,n,fn,prod_err)
qnode_ptr_t p ;
float alpha ;
int n, prod_err ;
string fn ;

{ qnode_ptr_t create_node(), q, r ;
  param_t f ;
  float lapu(), lapv(), flow_l2_norm(), u_bar, v_bar, avg, std ;
  int i, j, k ;

  q = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst) ;
  q->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;

  if (prod_err) {
    r = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst) ;
    r->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;
    load_velocity(r,fn) ;
  }

  for (i = p->ofst ; i < p->sizy ; i++) {
    for (j = p->ofst ; j < p->sizx ; j++) {
      (*p->flow_ptr)[p->res*i + j].x = 0.0 ;
      (*p->flow_ptr)[p->res*i + j].y = 0.0 ;
    }
  }
  for (k = 0 ; k < n ; k++) {
    for (i = p->ofst ; i < p->sizy ; i++) {
      for (j = p->ofst ; j < p->sizx ; j++) {
        (*q->flow_ptr)[q->res*i + j] = (*p->flow_ptr)[p->res*i + j] ;
      }
    }
    for (i = p->ofst ; i < p->sizy - p->ofst ; i++) {
      for (j = p->ofst ; j < p->sizx - p->ofst ; j++) {
        if ((*p->param_ptr[p->sizz/2])[p->res*i + j].err == NO_ERROR) {
          f = (*p->param_ptr[p->sizz/2])[p->res*i + j] ;

          u_bar = lapu(q,i,j) ;
          v_bar = lapv(q,i,j) ;

          (*p->flow_ptr)[p->res*i + j].x =
          u_bar - f.fx*(f.fx*u_bar + f.fy*v_bar + f.ft)
          /(pow(f.fx,2.0) + pow(f.fy,2.0) + pow(alpha,2.0)) ;

          (*p->flow_ptr)[p->res*i + j].y =
          v_bar - f.fy*(f.fx*u_bar + f.fy*v_bar + f.ft)
          /(pow(f.fx,2.0) + pow(f.fy,2.0) + pow(alpha,2.0)) ;
        }
      }
    }
    printf(" Iteration %3d :\n",k+1) ;
    if (prod_err) {
      flow_error(p,r,&avg,&std) ;
      printf("    Average Angular Error : %10.5f\n",avg) ;
      printf("       Standard Deviation : %10.5f\n",std) ;
    }
    printf("       L2 Norm Difference : %10.5f\n",flow_l2_norm(q,p)) ;
    fflush(stdout) ;
  }
  free((disp_field512_t *)q->flow_ptr) ;
  free(q) ;
  if (prod_err) {
    free((disp_field512_t *)r->flow_ptr) ;
    free(r) ;
  }
}